

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O1

ON_RTreeBBox * NodeCover(ON_RTreeBBox *__return_storage_ptr__,ON_RTreeNode *a_node)

{
  double *pdVar1;
  uint uVar2;
  ON_RTreeBranch *pOVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  ulong uVar3;
  
  if (0 < a_node->m_count) {
    uVar2 = a_node->m_count - 1;
    uVar3 = (ulong)uVar2;
    dVar9 = a_node->m_branch[uVar3].m_rect.m_min[1];
    pdVar1 = a_node->m_branch[uVar3].m_rect.m_min + 2;
    dVar11 = *pdVar1;
    dVar13 = pdVar1[1];
    pdVar1 = a_node->m_branch[uVar3].m_rect.m_max + 1;
    dVar15 = *pdVar1;
    dVar17 = pdVar1[1];
    __return_storage_ptr__->m_min[0] = a_node->m_branch[uVar3].m_rect.m_min[0];
    __return_storage_ptr__->m_min[1] = dVar9;
    __return_storage_ptr__->m_max[1] = dVar15;
    __return_storage_ptr__->m_max[2] = dVar17;
    __return_storage_ptr__->m_min[2] = dVar11;
    __return_storage_ptr__->m_max[0] = dVar13;
    uVar5 = SUB84(__return_storage_ptr__->m_min[0],0);
    uVar7 = (undefined4)((ulong)__return_storage_ptr__->m_min[0] >> 0x20);
    if (uVar2 != 0) {
      pOVar4 = a_node->m_branch;
      uVar6 = uVar5;
      uVar8 = uVar7;
      dVar9 = __return_storage_ptr__->m_min[1];
      dVar11 = __return_storage_ptr__->m_min[2];
      dVar13 = __return_storage_ptr__->m_max[0];
      dVar15 = __return_storage_ptr__->m_max[1];
      dVar17 = __return_storage_ptr__->m_max[2];
      do {
        dVar10 = (pOVar4->m_rect).m_min[0];
        uVar5 = SUB84(dVar10,0);
        uVar7 = (int)((ulong)dVar10 >> 0x20);
        if ((double)CONCAT44(uVar8,uVar6) <= dVar10) {
          uVar5 = uVar6;
          uVar7 = uVar8;
        }
        dVar10 = (pOVar4->m_rect).m_min[1];
        if (dVar9 <= dVar10) {
          dVar10 = dVar9;
        }
        dVar12 = (pOVar4->m_rect).m_min[2];
        if (dVar11 <= dVar12) {
          dVar12 = dVar11;
        }
        dVar14 = (pOVar4->m_rect).m_max[0];
        if (dVar14 <= dVar13) {
          dVar14 = dVar13;
        }
        dVar16 = (pOVar4->m_rect).m_max[1];
        if (dVar16 <= dVar15) {
          dVar16 = dVar15;
        }
        dVar18 = (pOVar4->m_rect).m_max[2];
        if (dVar18 <= dVar17) {
          dVar18 = dVar17;
        }
        pOVar4 = pOVar4 + 1;
        uVar2 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar2;
        uVar6 = uVar5;
        uVar8 = uVar7;
        dVar9 = dVar10;
        dVar11 = dVar12;
        dVar13 = dVar14;
        dVar15 = dVar16;
        dVar17 = dVar18;
      } while (uVar2 != 0);
      __return_storage_ptr__->m_min[1] = dVar10;
      __return_storage_ptr__->m_min[2] = dVar12;
      __return_storage_ptr__->m_max[0] = dVar14;
      __return_storage_ptr__->m_max[1] = dVar16;
      __return_storage_ptr__->m_max[2] = dVar18;
    }
    __return_storage_ptr__->m_min[0] = (double)CONCAT44(uVar7,uVar5);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->m_max[1] = 0.0;
  __return_storage_ptr__->m_max[2] = 0.0;
  __return_storage_ptr__->m_min[2] = 0.0;
  __return_storage_ptr__->m_max[0] = 0.0;
  __return_storage_ptr__->m_min[0] = 0.0;
  __return_storage_ptr__->m_min[1] = 0.0;
  return __return_storage_ptr__;
}

Assistant:

static ON_RTreeBBox NodeCover(ON_RTreeNode* a_node)
{
  int i;
  const ON_RTreeBranch* branch;
  ON_RTreeBBox rect;

  if ( (i = a_node->m_count) > 0 )
  {
    rect = a_node->m_branch[--i].m_rect;
    for ( branch = a_node->m_branch; i; i--, branch++ )
    {
#if (3 == ON_RTree_NODE_DIM)
      if ( rect.m_min[0] > branch->m_rect.m_min[0] )
        rect.m_min[0] = branch->m_rect.m_min[0];
      if ( rect.m_min[1] > branch->m_rect.m_min[1] )
        rect.m_min[1] = branch->m_rect.m_min[1];
      if ( rect.m_min[2] > branch->m_rect.m_min[2] )
        rect.m_min[2] = branch->m_rect.m_min[2];
      if ( rect.m_max[0] < branch->m_rect.m_max[0] )
        rect.m_max[0] = branch->m_rect.m_max[0];
      if ( rect.m_max[1] < branch->m_rect.m_max[1] )
        rect.m_max[1] = branch->m_rect.m_max[1];
      if ( rect.m_max[2] < branch->m_rect.m_max[2] )
        rect.m_max[2] = branch->m_rect.m_max[2];
#else
      for( int j = 0; j < ON_RTree_NODE_DIM; j++ )
      {
        if ( rect.m_min[j] > branch->m_rect.m_min[j] )
          rect.m_min[j] = branch->m_rect.m_min[j];
        if ( rect.m_max[j] < branch->m_rect.m_max[j] )
          rect.m_max[j] = branch->m_rect.m_max[j];
      }
#endif
    }
  }
  else
  {
    InitRect(&rect);
  }

  return rect;
}